

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenscanner.cpp
# Opt level: O0

TokenScanner * __thiscall TokenScanner::scanNumber_abi_cxx11_(TokenScanner *this)

{
  int iVar1;
  allocator local_59;
  string local_58 [32];
  int local_38;
  int local_34;
  int xch;
  int ch;
  NumberScannerState state;
  allocator local_1a;
  undefined1 local_19;
  TokenScanner *this_local;
  string *token;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  xch = 0;
  while (xch != 6) {
    local_34 = std::istream::get();
    local_38 = 0x65;
    switch(xch) {
    case 0:
      iVar1 = isdigit(local_34);
      if (iVar1 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_58,"Internal error: illegal call to scanNumber",&local_59);
        error((string *)local_58);
        std::__cxx11::string::~string(local_58);
        std::allocator<char>::~allocator((allocator<char> *)&local_59);
      }
      xch = 1;
      break;
    case 2:
      if ((local_34 == 0x45) || (local_34 == 0x65)) {
        xch = 3;
        local_38 = local_34;
      }
      else {
        iVar1 = isdigit(local_34);
        if (iVar1 == 0) {
          if (local_34 != -1) {
            std::istream::unget();
          }
          xch = 6;
        }
      }
      break;
    case 4:
      iVar1 = isdigit(local_34);
      if (iVar1 == 0) {
        if (local_34 != -1) {
          std::istream::unget();
        }
        std::istream::unget();
        std::istream::unget();
        xch = 6;
      }
      else {
        xch = 5;
      }
      break;
    default:
      xch = 6;
    }
    if (xch != 6) {
      std::__cxx11::string::operator+=((string *)this,(char)local_34);
    }
  }
  return this;
}

Assistant:

string TokenScanner::scanNumber() {
   string token = "";
   NumberScannerState state = INITIAL_STATE;
   while (state != FINAL_STATE) {
      int ch = isp->get();
      int xch = 'e';
      switch (state) {
       case INITIAL_STATE:
         if (!isdigit(ch)) {
            error("Internal error: illegal call to scanNumber");
         }
         state = BEFORE_DECIMAL_POINT;
         break;
       case BEFORE_DECIMAL_POINT:
         if (ch == '.') {
            state = AFTER_DECIMAL_POINT;
         } else if (ch == 'E' || ch == 'e') {
            state = STARTING_EXPONENT;
            xch = ch;
         } else if (!isdigit(ch)) {
            if (ch != EOF) isp->unget();
            state = FINAL_STATE;
         }
         break;
       case AFTER_DECIMAL_POINT:
         if (ch == 'E' || ch == 'e') {
            state = STARTING_EXPONENT;
            xch = ch;
         } else if (!isdigit(ch)) {
            if (ch != EOF) isp->unget();
            state = FINAL_STATE;
         }
         break;
       case STARTING_EXPONENT:
         if (ch == '+' || ch == '-') {
            state = FOUND_EXPONENT_SIGN;
         } else if (isdigit(ch)) {
            state = SCANNING_EXPONENT;
         } else {
            if (ch != EOF) isp->unget();
            isp->unget();
            state = FINAL_STATE;
         }
         break;
       case FOUND_EXPONENT_SIGN:
         if (isdigit(ch)) {
            state = SCANNING_EXPONENT;
         } else {
            if (ch != EOF) isp->unget();
            isp->unget();
            isp->unget();
            state = FINAL_STATE;
         }
         break;
       case SCANNING_EXPONENT:
         if (!isdigit(ch)) {
            if (ch != EOF) isp->unget();
            state = FINAL_STATE;
         }
         break;
       default:
         state = FINAL_STATE;
         break;
      }
      if (state != FINAL_STATE) {
         token += char(ch);
      }
   }
   return token;
}